

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O3

int perform(CURLM *multi)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  char *__format;
  timeval tVar5;
  timeval older;
  timeval older_00;
  int handles;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1d0 = -99;
  local_1c8.tv_sec = 0;
  local_1c8.tv_usec = 100000;
  uVar1 = curl_multi_perform(multi,&local_1cc);
  if (uVar1 == 0) {
    do {
      if (local_1cc < 0) {
        __format = 
        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
        uVar4 = 0x2d;
LAB_00102abf:
        fprintf(_stderr,__format,
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
                ,uVar4);
        return 0x7a;
      }
      tVar5 = tutil_tvnow();
      older.tv_usec = tv_test_start.tv_usec;
      older.tv_sec = tv_test_start.tv_sec;
      lVar3 = tutil_tvdiff(tVar5,older);
      if (60000 < lVar3) {
        perform_cold_1();
        return 0x7d;
      }
      if (local_1cc == 0) {
        return 0;
      }
      local_b8.__fds_bits[0xe] = 0;
      local_b8.__fds_bits[0xf] = 0;
      local_b8.__fds_bits[0xc] = 0;
      local_b8.__fds_bits[0xd] = 0;
      local_b8.__fds_bits[10] = 0;
      local_b8.__fds_bits[0xb] = 0;
      local_b8.__fds_bits[8] = 0;
      local_b8.__fds_bits[9] = 0;
      local_b8.__fds_bits[6] = 0;
      local_b8.__fds_bits[7] = 0;
      local_b8.__fds_bits[4] = 0;
      local_b8.__fds_bits[5] = 0;
      local_b8.__fds_bits[2] = 0;
      local_b8.__fds_bits[3] = 0;
      local_b8.__fds_bits[0] = 0;
      local_b8.__fds_bits[1] = 0;
      local_138.__fds_bits[0] = 0;
      local_138.__fds_bits[1] = 0;
      local_138.__fds_bits[2] = 0;
      local_138.__fds_bits[3] = 0;
      local_138.__fds_bits[4] = 0;
      local_138.__fds_bits[5] = 0;
      local_138.__fds_bits[6] = 0;
      local_138.__fds_bits[7] = 0;
      local_138.__fds_bits[8] = 0;
      local_138.__fds_bits[9] = 0;
      local_138.__fds_bits[10] = 0;
      local_138.__fds_bits[0xb] = 0;
      local_138.__fds_bits[0xc] = 0;
      local_138.__fds_bits[0xd] = 0;
      local_138.__fds_bits[0xe] = 0;
      local_138.__fds_bits[0xf] = 0;
      local_1b8.__fds_bits[0] = 0;
      local_1b8.__fds_bits[1] = 0;
      local_1b8.__fds_bits[2] = 0;
      local_1b8.__fds_bits[3] = 0;
      local_1b8.__fds_bits[4] = 0;
      local_1b8.__fds_bits[5] = 0;
      local_1b8.__fds_bits[6] = 0;
      local_1b8.__fds_bits[7] = 0;
      local_1b8.__fds_bits[8] = 0;
      local_1b8.__fds_bits[9] = 0;
      local_1b8.__fds_bits[10] = 0;
      local_1b8.__fds_bits[0xb] = 0;
      local_1b8.__fds_bits[0xc] = 0;
      local_1b8.__fds_bits[0xd] = 0;
      local_1b8.__fds_bits[0xe] = 0;
      local_1b8.__fds_bits[0xf] = 0;
      iVar2 = curl_multi_fdset(multi,&local_b8,&local_138,&local_1b8,&local_1d0);
      if (iVar2 != 0) {
        perform_cold_2();
        return iVar2;
      }
      if (local_1d0 < -1) {
        __format = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
        uVar4 = 0x3c;
        goto LAB_00102abf;
      }
      iVar2 = select_wrapper(local_1d0 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
      if (iVar2 == -1) {
        perform_cold_4();
        return 0x79;
      }
      tVar5 = tutil_tvnow();
      older_00.tv_usec = tv_test_start.tv_usec;
      older_00.tv_sec = tv_test_start.tv_sec;
      lVar3 = tutil_tvdiff(tVar5,older_00);
      if (60000 < lVar3) {
        perform_cold_3();
        return 0x7d;
      }
      local_1d0 = -99;
      local_1c8.tv_sec = 0;
      local_1c8.tv_usec = 100000;
      uVar1 = curl_multi_perform(multi,&local_1cc);
    } while (uVar1 == 0);
  }
  __stream = _stderr;
  uVar4 = curl_multi_strerror(uVar1);
  fprintf(__stream,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
          ,0x2d,(ulong)uVar1,uVar4);
  return uVar1;
}

Assistant:

static int perform(CURLM *multi)
{
  int handles;
  fd_set fdread, fdwrite, fdexcep;
  int res = 0;

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 0;
    interval.tv_usec = 100000L; /* 100 ms */

    res_multi_perform(multi, &handles);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(!handles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    res_multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);
    if(res)
      return res;

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    res_select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}